

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall
Js::ScriptContext::SetFunctionInRecyclerToProfileMode
          (ScriptContext *this,bool enumerateNonUserFunctionsOnly)

{
  char16_t *pcVar1;
  bool bVar2;
  AutoEnumeratingRecyclerObjects local_20;
  AutoEnumeratingRecyclerObjects enumeratingRecyclerObjects;
  bool enumerateNonUserFunctionsOnly_local;
  ScriptContext *this_local;
  
  enumeratingRecyclerObjects.m_scriptContext._7_1_ = enumerateNonUserFunctionsOnly;
  bVar2 = IsTraceDomCall(this);
  pcVar1 = L"LdFalse";
  if (bVar2) {
    pcVar1 = L"LdTrue";
  }
  Output::Trace(ScriptProfilerPhase,
                L"ScriptContext::SetFunctionInRecyclerToProfileMode started (m_fTraceDomCall : %s)\n"
                ,pcVar1 + 2);
  AutoEnumeratingRecyclerObjects::AutoEnumeratingRecyclerObjects(&local_20,this);
  this->m_enumerateNonUserFunctionsOnly =
       (bool)(enumeratingRecyclerObjects.m_scriptContext._7_1_ & 1);
  Memory::Recycler::EnumerateObjects
            (this->recycler,EnumClassMask,RecyclerEnumClassEnumeratorCallback);
  Output::Trace(ScriptProfilerPhase,L"ScriptContext::SetFunctionInRecyclerToProfileMode ended\n");
  AutoEnumeratingRecyclerObjects::~AutoEnumeratingRecyclerObjects(&local_20);
  return;
}

Assistant:

void ScriptContext::SetFunctionInRecyclerToProfileMode(bool enumerateNonUserFunctionsOnly/* = false*/)
    {
        OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("ScriptContext::SetFunctionInRecyclerToProfileMode started (m_fTraceDomCall : %s)\n"), IsTrueOrFalse(IsTraceDomCall()));

        // Mark this script context isEnumeratingRecyclerObjects
        AutoEnumeratingRecyclerObjects enumeratingRecyclerObjects(this);

        m_enumerateNonUserFunctionsOnly = enumerateNonUserFunctionsOnly;

        this->recycler->EnumerateObjects(JavascriptLibrary::EnumFunctionClass, &ScriptContext::RecyclerEnumClassEnumeratorCallback);

        OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("ScriptContext::SetFunctionInRecyclerToProfileMode ended\n"));
    }